

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

void __thiscall
mjs::global_object_impl::define_thrower_accessor
          (global_object_impl *this,object *o,char *property_name)

{
  undefined1 local_30 [32];
  
  (*(this->super_global_object).super_object._vptr_object[0x13])(local_30 + 0x10,this);
  gc_heap::unsafe_create_from_position<mjs::object>
            ((gc_heap *)local_30,(uint32_t)(this->super_global_object).super_object.heap_);
  object::define_accessor_property
            (o,(string *)(local_30 + 0x10),(object_ptr *)local_30,dont_delete|dont_enum);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_30);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_30 + 0x10));
  return;
}

Assistant:

void define_thrower_accessor(object& o, const char* property_name) override {
        o.define_accessor_property(common_string(property_name), thrower_.track(heap()), property_attribute::dont_enum|property_attribute::dont_delete);
    }